

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_curves.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  uint uVar3;
  ASN1_OBJECT *pAVar4;
  char *pcVar5;
  char *s;
  char *__s2;
  EC_KEY *eckey;
  EC_GROUP *group;
  BN_CTX *ctx;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  EC_POINT *p;
  BIGNUM *a;
  BIGNUM *a_00;
  BIGNUM *r;
  BIGNUM *a_01;
  BIGNUM *r_00;
  BIGNUM *r_01;
  EC_POINT *pEVar9;
  EC_POINT *r_02;
  long lVar10;
  char **ppcVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  
  uVar3 = 0x347;
  ppcVar11 = &test_curves[0].name;
  uVar12 = 0;
  do {
    printf("\x1b[1;34mTest curve NID %d\x1b[m",(ulong)uVar3);
    pcVar5 = *ppcVar11;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = OBJ_nid2sn(uVar3);
      if (pcVar5 != (char *)0x0) {
        pcVar5 = OBJ_nid2sn(uVar3);
        goto LAB_0010368b;
      }
    }
    else {
LAB_0010368b:
      printf("\x1b[1;34m: %s\x1b[m",pcVar5);
    }
    putchar(10);
    pAVar4 = OBJ_nid2obj(uVar3);
    if (pAVar4 == (ASN1_OBJECT *)0x0) {
      printf("\x1b[1;31mNID %d not found\x1b[m\n",(ulong)uVar3);
LAB_00103cbf:
      uVar3 = 1;
    }
    else {
      pcVar5 = OBJ_nid2sn(uVar3);
      if (pcVar5 == (char *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("sn = OBJ_nid2sn(nid)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x6a);
      }
      s = OBJ_nid2ln(uVar3);
      if (s == (char *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("ln = OBJ_nid2ln(nid)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x6b);
      }
      __s1 = *ppcVar11;
      if (__s1 != (char *)0x0) {
        __s2 = OBJ_nid2sn(uVar3);
        iVar1 = strcmp(__s1,__s2);
        if (iVar1 != 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("!strcmp(tc->name, OBJ_nid2sn(nid))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                      ,0x6d);
        }
      }
      uVar2 = OBJ_sn2nid(pcVar5);
      if (uVar3 != uVar2) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("nid == OBJ_sn2nid(sn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x6e);
      }
      uVar2 = OBJ_ln2nid(s);
      if (uVar3 != uVar2) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("nid == OBJ_ln2nid(ln)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x6f);
      }
      eckey = EC_KEY_new();
      if (eckey == (EC_KEY *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("ec = EC_KEY_new()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x72);
      }
      iVar1 = fill_GOST_EC_params((EC_KEY *)eckey,uVar3);
      if (iVar1 == 0) {
        puts("\x1b[1;31mfill_GOST_EC_params FAIL\x1b[m");
        ERR_print_errors_fp(_stderr);
        goto LAB_00103cbf;
      }
      group = EC_KEY_get0_group(eckey);
      if (group == (EC_GROUP *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("group = EC_KEY_get0_group(ec)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x7a);
      }
      ctx = BN_CTX_new();
      if (ctx == (BN_CTX *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("ctx = BN_CTX_new()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x7d);
      }
      pBVar6 = BN_new();
      if (pBVar6 == (BIGNUM *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("p = BN_new()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x7f);
      }
      pBVar7 = BN_new();
      if (pBVar7 == (BIGNUM *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("a = BN_new()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x80);
      }
      pBVar8 = BN_new();
      if (pBVar8 == (BIGNUM *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("b = BN_new()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x81);
      }
      EC_GROUP_get_curve(group,pBVar6,pBVar7,pBVar8,ctx);
      print_bn("p",(BIGNUM *)pBVar6);
      print_bn("a",(BIGNUM *)pBVar7);
      print_bn("b",(BIGNUM *)pBVar8);
      iVar1 = BN_is_zero(pBVar6);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("!BN_is_zero(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x86);
      }
      iVar1 = BN_is_odd(pBVar6);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("BN_is_odd(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x87);
      }
      iVar1 = BN_is_zero(pBVar7);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("!BN_is_zero(a)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x88);
      }
      iVar1 = BN_is_zero(pBVar8);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("!BN_is_zero(b)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x89);
      }
      p = EC_GROUP_get0_generator(group);
      if (p == (EC_POINT *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("generator = EC_GROUP_get0_generator(group)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x8d);
      }
      a = BN_new();
      if (a == (BIGNUM *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("x = BN_new()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x8f);
      }
      a_00 = BN_new();
      if (a_00 == (BIGNUM *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("y = BN_new()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x90);
      }
      iVar1 = EC_POINT_get_affine_coordinates(group,p,a,a_00,ctx);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_get_affine_coordinates(group, generator, x, y, ctx)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x91);
      }
      print_bn("x",(BIGNUM *)a);
      print_bn("y",(BIGNUM *)a_00);
      iVar1 = BN_is_zero(a_00);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("!BN_is_zero(y)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x94);
      }
      iVar1 = EC_POINT_is_at_infinity(group,p);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_is_at_infinity(group, generator) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x97);
      }
      iVar1 = BN_is_negative(a);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("!BN_is_negative(x)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x9a);
      }
      iVar1 = BN_is_negative(a_00);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("!BN_is_negative(y)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x9b);
      }
      iVar1 = BN_cmp(a,pBVar6);
      if (-1 < iVar1) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("BN_cmp(x, p) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x9c);
      }
      iVar1 = BN_cmp(a_00,pBVar6);
      if (-1 < iVar1) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("BN_cmp(y, p) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0x9d);
      }
      iVar1 = EC_POINT_is_on_curve(group,p,ctx);
      if (iVar1 != 1) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_is_on_curve(group, generator, ctx) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xa0);
      }
      r = BN_new();
      a_01 = BN_new();
      r_00 = BN_new();
      r_01 = BN_new();
      auVar13._0_4_ = -(uint)((int)((ulong)r >> 0x20) == 0 && (int)r == 0);
      auVar13._4_4_ = -(uint)((int)a_01 == 0 && (int)((ulong)a_01 >> 0x20) == 0);
      auVar13._8_4_ = -(uint)((int)((ulong)r_00 >> 0x20) == 0 && (int)r_00 == 0);
      auVar13._12_4_ = -(uint)((int)r_01 == 0 && (int)((ulong)r_01 >> 0x20) == 0);
      iVar1 = movmskps((int)r_01,auVar13);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("yy && r && xxx && ax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xa9);
      }
      BN_set_word(a_01,2);
      BN_mod_exp(r,a_00,a_01,pBVar6,ctx);
      BN_set_word(a_01,3);
      BN_mod_exp(r_00,a,a_01,pBVar6,ctx);
      BN_mod_mul(r_01,pBVar7,a,pBVar6,ctx);
      BN_mod_add(r_00,r_00,r_01,pBVar6,ctx);
      BN_mod_add(r_00,r_00,pBVar8,pBVar6,ctx);
      iVar1 = BN_cmp(r,r_00);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("BN_cmp(yy, xxx) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xb1);
      }
      BN_free(r);
      BN_free(a_01);
      BN_free(r_00);
      BN_free(r_01);
      BN_free(pBVar6);
      BN_free(pBVar7);
      BN_free(pBVar8);
      BN_free(a);
      BN_free(a_00);
      pBVar6 = (BIGNUM *)EC_GROUP_get0_order(group);
      if (pBVar6 == (BIGNUM *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("order = EC_GROUP_get0_order(group)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xbe);
      }
      iVar1 = BN_is_zero(pBVar6);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("!BN_is_zero(order)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xbf);
      }
      print_bn("q",(BIGNUM *)pBVar6);
      iVar1 = BN_is_odd(pBVar6);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("BN_is_odd(order)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xc1);
      }
      pEVar9 = EC_POINT_new(group);
      if (pEVar9 == (EC_POINT *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("(point = EC_POINT_new(group))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xc3);
      }
      iVar1 = EC_POINT_mul(group,pEVar9,(BIGNUM *)0x0,p,pBVar6,ctx);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_mul(group, point, NULL, generator, order, ctx)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xc4);
      }
      iVar1 = EC_POINT_is_at_infinity(group,pEVar9);
      if (iVar1 != 1) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_is_at_infinity(group, point) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xc6);
      }
      EC_POINT_free(pEVar9);
      pBVar7 = BN_new();
      pBVar8 = BN_new();
      pEVar9 = EC_POINT_new(group);
      r_02 = EC_POINT_new(group);
      BN_set_word(pBVar7,3);
      BN_set_word(pBVar8,3);
      BN_add(pBVar8,pBVar8,pBVar6);
      iVar1 = EC_POINT_mul(group,pEVar9,(BIGNUM *)0x0,p,pBVar7,ctx);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_mul(group, p1, NULL, generator, k1, ctx)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xd1);
      }
      iVar1 = EC_POINT_mul(group,r_02,(BIGNUM *)0x0,p,pBVar8,ctx);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_mul(group, p2, NULL, generator, k2, ctx)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xd2);
      }
      iVar1 = EC_POINT_cmp(group,pEVar9,r_02,ctx);
      if (iVar1 != 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EC_POINT_cmp(group, p1, p2, ctx) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xd3);
      }
      BN_free(pBVar7);
      BN_free(pBVar8);
      EC_POINT_free(pEVar9);
      EC_POINT_free(r_02);
      lVar10 = EC_GROUP_get0_cofactor(group);
      if (lVar10 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("c = EC_GROUP_get0_cofactor(group)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xdb);
      }
      iVar1 = BN_is_word(lVar10,1);
      if ((iVar1 == 0) && (iVar1 = BN_is_word(lVar10,4), iVar1 == 0)) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("BN_is_word(c, 1) || BN_is_word(c, 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_curves.c"
                    ,0xdc);
      }
      BN_CTX_free(ctx);
      EC_KEY_free(eckey);
      puts("\x1b[1;32m  Test passed\x1b[m");
      uVar3 = 0;
    }
    uVar12 = uVar12 | uVar3;
    uVar3 = *(uint *)(ppcVar11 + 2);
    ppcVar11 = ppcVar11 + 3;
    if (uVar3 == 0) {
      pcVar5 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (uVar12 == 0) {
        pcVar5 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      puts(pcVar5);
      return uVar12;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    struct test_curve *tc;
    for (tc = test_curves; tc->nid; tc++) {
	ret |= parameter_test(tc);
    }

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}